

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall TypeRef::TypeRef(TypeRef *this,InplaceStr name,TypeBase *subType)

{
  TypeBase::TypeBase(&this->super_TypeBase,0x12,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e30b8;
  this->subType = subType;
  (this->super_TypeBase).size = 8;
  (this->super_TypeBase).alignment = 4;
  (this->super_TypeBase).isGeneric = subType->isGeneric;
  (this->super_TypeBase).hasPointers = true;
  return;
}

Assistant:

TypeRef(InplaceStr name, TypeBase *subType): TypeBase(myTypeID, name), subType(subType)
	{
		size = NULLC_PTR_SIZE;
		alignment = 4;

		isGeneric = subType->isGeneric;

		hasPointers = true;
	}